

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_TypeChecker.cpp
# Opt level: O3

void __thiscall
psy::C::TypeChecker::DiagnosticsReporter::ExpectedExpressionOfType_CORE
          (DiagnosticsReporter *this,SyntaxToken *tk,string *diagnosticID,string *category)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  long *plVar4;
  long *plVar5;
  string s;
  long *local_150;
  long local_140;
  long lStack_138;
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  DiagnosticDescriptor local_d0;
  SyntaxToken local_68;
  
  std::operator+(&local_d0.id_,"expected expression of ",category);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_140 = *plVar5;
    lStack_138 = plVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *plVar5;
    local_150 = (long *)*plVar4;
  }
  lVar2 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  paVar1 = &local_d0.id_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.id_._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.id_._M_dataplus._M_p,local_d0.id_.field_2._M_allocated_capacity + 1);
  }
  local_130[0] = local_120;
  pcVar3 = (diagnosticID->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,pcVar3,pcVar3 + diagnosticID->_M_string_length);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"[[expected expression of type]]","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char*>((string *)local_110,local_150,lVar2 + (long)local_150);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_d0,local_130,local_f0,local_110,2,4);
  local_68.field_10 = tk->field_10;
  local_68.tree_ = tk->tree_;
  local_68.syntaxK_ = tk->syntaxK_;
  local_68.byteSize_ = tk->byteSize_;
  local_68.charSize_ = tk->charSize_;
  local_68._14_2_ = *(undefined2 *)&tk->field_0xe;
  local_68.byteOffset_ = tk->byteOffset_;
  local_68.charOffset_ = tk->charOffset_;
  local_68.matchingBracket_ = tk->matchingBracket_;
  local_68.field_7 = tk->field_7;
  local_68._34_2_ = *(undefined2 *)&tk->field_0x22;
  local_68.lineno_ = tk->lineno_;
  local_68.column_ = tk->column_;
  local_68._44_4_ = *(undefined4 *)&tk->field_0x2c;
  diagnose(this,&local_d0,&local_68);
  SyntaxToken::~SyntaxToken(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.description_._M_dataplus._M_p != &local_d0.description_.field_2) {
    operator_delete(local_d0.description_._M_dataplus._M_p,
                    local_d0.description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.title_._M_dataplus._M_p != &local_d0.title_.field_2) {
    operator_delete(local_d0.title_._M_dataplus._M_p,
                    local_d0.title_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.id_._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.id_._M_dataplus._M_p,local_d0.id_.field_2._M_allocated_capacity + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  return;
}

Assistant:

void TypeChecker::DiagnosticsReporter::ExpectedExpressionOfType_CORE(
        SyntaxToken tk,
        const std::string& diagnosticID,
        const std::string& category)
{
    std::string s = "expected expression of "
            + category
            + " type";
    diagnose(DiagnosticDescriptor(
                 diagnosticID,
                 "[[expected expression of type]]",
                 s,
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::TypeChecking),
             tk);
}